

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall wasm::TranslateToFuzzReader::_makenone(TranslateToFuzzReader *this)

{
  WeightedOption weightedOption;
  WeightedOption rest;
  WeightedOption rest_1;
  WeightedOption rest_2;
  WeightedOption rest_3;
  uint32_t uVar1;
  Expression *pEVar2;
  mapped_type *this_00;
  FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *pFVar3;
  code *pcVar4;
  long extraout_RDX;
  long *plVar5;
  size_t i;
  ulong uVar6;
  code *local_130;
  undefined8 local_128;
  ulong local_120;
  _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>_>_>
  local_118;
  code *local_e8;
  undefined8 uStack_e0;
  code *local_d8;
  undefined8 uStack_d0;
  code *local_c8;
  undefined8 uStack_c0;
  code *local_b8;
  undefined8 uStack_b0;
  size_t local_a8;
  code *local_a0;
  undefined8 uStack_98;
  size_t local_90;
  code *local_88;
  undefined8 uStack_80;
  size_t local_78;
  code *local_70;
  undefined8 uStack_68;
  size_t local_60;
  code *local_58;
  undefined8 uStack_50;
  size_t local_48;
  Random *local_40;
  key_type local_34;
  
  local_40 = &this->random;
  uVar1 = Random::upTo(local_40,100);
  if (this->LOGGING_PERCENT <= uVar1) {
    local_118._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_118._M_impl.super__Rb_tree_header._M_header;
    local_118._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_118._M_impl._0_8_ = 0;
    local_118._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_118._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_118._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_b8 = makeStore;
    uStack_b0 = 0;
    local_a8 = 2;
    local_a0 = makeBreak;
    uStack_98 = 0;
    local_88 = makeLoop;
    uStack_80 = 0;
    local_90 = 2;
    local_78 = 2;
    local_70 = makeIf;
    uStack_68 = 0;
    local_58 = makeBlock;
    uStack_50 = 0;
    local_60 = 2;
    local_48 = 2;
    local_130 = makeLocalSet;
    local_128 = 0;
    local_34.features = 0;
    local_120 = 4;
    local_118._M_impl.super__Rb_tree_header._M_header._M_right =
         local_118._M_impl.super__Rb_tree_header._M_header._M_left;
    for (uVar6 = 0; uVar6 < local_120; uVar6 = uVar6 + 1) {
      this_00 = std::
                map<wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>_>_>
                ::operator[]((map<wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>_>_>
                              *)&local_118,&local_34);
      std::
      vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>
      ::push_back(this_00,(value_type *)&local_130);
    }
    local_e8 = makeDrop;
    uStack_e0 = 0;
    local_d8 = makeNop;
    uStack_d0 = 0;
    local_c8 = makeGlobalSet;
    uStack_c0 = 0;
    weightedOption._8_8_ = uStack_50;
    weightedOption.option = (offset_in_TranslateToFuzzReader_to_subr)local_58;
    weightedOption.weight = local_48;
    rest._8_8_ = uStack_68;
    rest.option = (offset_in_TranslateToFuzzReader_to_subr)local_70;
    rest.weight = local_60;
    rest_1._8_8_ = uStack_80;
    rest_1.option = (offset_in_TranslateToFuzzReader_to_subr)local_88;
    rest_1.weight = local_78;
    rest_2._8_8_ = uStack_98;
    rest_2.option = (offset_in_TranslateToFuzzReader_to_subr)local_a0;
    rest_2.weight = local_90;
    rest_3._8_8_ = uStack_b0;
    rest_3.option = (offset_in_TranslateToFuzzReader_to_subr)local_b8;
    rest_3.weight = local_a8;
    pFVar3 = Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::
             add<wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                       ((FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                         *)&local_118,(FeatureSet)local_34.features,weightedOption,rest,rest_1,
                        rest_2,rest_3,0x153eb4,0,0x154098,0,0x1566aa);
    pFVar3 = Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
             ::add<>(pFVar3,(FeatureSet)0x10,0x15679e);
    pFVar3 = Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
             ::add<>(pFVar3,(FeatureSet)0x1,0x155480);
    Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::add<>
              (pFVar3,(FeatureSet)0x500,0x1542f4);
    pcVar4 = (code *)_wasm__TranslateToFuzzReader___constwasm__Random__pick<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_wasm__Random__FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>___
                               (local_40,(FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                                          *)&local_118);
    plVar5 = (long *)((long)&this->wasm + extraout_RDX);
    if (((ulong)pcVar4 & 1) != 0) {
      pcVar4 = *(code **)(pcVar4 + *plVar5 + -1);
    }
    pEVar2 = (Expression *)(*pcVar4)(plVar5,0);
    std::
    _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>_>_>
    ::~_Rb_tree(&local_118);
    return pEVar2;
  }
  if (uVar1 < this->LOGGING_PERCENT >> 1) {
    pEVar2 = makeLogging(this);
    return pEVar2;
  }
  pEVar2 = makeMemoryHashLogging(this);
  return pEVar2;
}

Assistant:

Expression* TranslateToFuzzReader::_makenone() {
  auto choice = upTo(100);
  if (choice < LOGGING_PERCENT) {
    if (choice < LOGGING_PERCENT / 2) {
      return makeLogging();
    } else {
      return makeMemoryHashLogging();
    }
  }
  using Self = TranslateToFuzzReader;
  auto options = FeatureOptions<Expression* (Self::*)(Type)>();
  using WeightedOption = decltype(options)::WeightedOption;
  options
    .add(FeatureSet::MVP,
         WeightedOption{&Self::makeLocalSet, VeryImportant},
         WeightedOption{&Self::makeBlock, Important},
         WeightedOption{&Self::makeIf, Important},
         WeightedOption{&Self::makeLoop, Important},
         WeightedOption{&Self::makeBreak, Important},
         WeightedOption{&Self::makeStore, Important},
         &Self::makeCall,
         &Self::makeCallIndirect,
         &Self::makeDrop,
         &Self::makeNop,
         &Self::makeGlobalSet)
    .add(FeatureSet::BulkMemory, &Self::makeBulkMemory)
    .add(FeatureSet::Atomics, &Self::makeAtomic)
    .add(FeatureSet::GC | FeatureSet::ReferenceTypes, &Self::makeCallRef);
  return (this->*pick(options))(Type::none);
}